

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

void predict_or_learn_active<true>(active *a,single_learner *base,example *ec)

{
  example *in_RDX;
  learner<char,_example> *in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  float threshold;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  LEARNER::learner<char,_example>::learn
            (in_RSI,in_RDX,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  fVar1 = (in_RDX->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    fVar1 = (*(float *)(**(long **)(in_RDI + 8) + 0x6c) + *(float *)(**(long **)(in_RDI + 8) + 0x68)
            ) * 0.5;
    fVar2 = ABS((in_RDX->pred).scalar - fVar1);
    fVar1 = LEARNER::learner<char,_example>::sensitivity(in_RSI,in_RDX,CONCAT44(fVar1,fVar2));
    in_RDX->confidence = fVar2 / fVar1;
  }
  return;
}

Assistant:

void predict_or_learn_active(active& a, single_learner& base, example& ec)
{
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.l.simple.label == FLT_MAX)
  {
    float threshold = (a.all->sd->max_label + a.all->sd->min_label) * 0.5f;
    ec.confidence = fabsf(ec.pred.scalar - threshold) / base.sensitivity(ec);
  }
}